

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O2

UVec2 __thiscall
vkt::texture::util::calcLevelBounds
          (util *this,Vec2 *lodBounds,int levelCount,VkSamplerMipmapMode mipmapFilter)

{
  int iVar1;
  int ndx;
  uint uVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  uVar2 = levelCount - 1;
  fVar6 = (float)(int)uVar2;
  *(undefined8 *)this = 0;
  if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_NEAREST) {
    fVar5 = lodBounds->m_data[0];
    if (0.5 < fVar5) {
      if (fVar6 + 0.5 <= fVar5) {
        iVar1 = (int)(*(float *)(&DAT_009f26a8 + (ulong)(uVar2 >> 0x1f) * 4) + fVar6);
      }
      else {
        fVar5 = ceilf(fVar5 + 0.5);
        iVar1 = (int)fVar5 + -1;
      }
      *(int *)this = iVar1;
    }
    fVar5 = lodBounds->m_data[1];
    iVar1 = 0;
    if (0.5 <= fVar5) {
      if (fVar6 + 0.5 <= fVar5) {
        iVar1 = (int)(fVar6 + *(float *)(&DAT_009f26a8 + (ulong)(uVar2 >> 0x1f) * 4));
      }
      else {
        fVar6 = floorf(fVar5 + 0.5);
        iVar1 = (int)fVar6;
      }
    }
    *(int *)(this + 4) = iVar1;
  }
  else {
    fVar5 = *(float *)(&DAT_009f26a8 + (ulong)(uVar2 >> 0x1f) * 4);
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      fVar4 = lodBounds->m_data[lVar3];
      iVar1 = (int)(fVar5 + fVar6);
      if ((fVar4 < fVar6) && (iVar1 = 0, 0.0 <= fVar4)) {
        fVar4 = floorf(fVar4);
        iVar1 = (int)fVar4;
      }
      *(int *)(this + lVar3 * 4) = iVar1;
    }
  }
  return (UVec2)(uint  [2])this;
}

Assistant:

UVec2 calcLevelBounds (const Vec2&			lodBounds,
					   const int			levelCount,
					   VkSamplerMipmapMode	mipmapFilter)
{
	DE_ASSERT(lodBounds[0] <= lodBounds[1]);
	DE_ASSERT(levelCount > 0);

	const float q = (float) (levelCount - 1);

	UVec2 levelBounds;

	if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_NEAREST)
	{
		if (lodBounds[0] <= 0.5f)
		{
			levelBounds[0] = 0;
		}
		else if (lodBounds[0] < q + 0.5f)
		{
			levelBounds[0] = deCeilFloatToInt32(lodBounds[0] + 0.5f) - 1;
		}
		else
		{
			levelBounds[0] = deRoundFloatToInt32(q);
		}

		if (lodBounds[1] < 0.5f)
		{
			levelBounds[1] = 0;
		}
		else if (lodBounds[1] < q + 0.5f)
		{
			levelBounds[1] = deFloorFloatToInt32(lodBounds[1] + 0.5f);
		}
		else
		{
			levelBounds[1] = deRoundFloatToInt32(q);
		}
	}
	else
	{
		for (int ndx = 0; ndx < 2; ++ndx)
		{
			if (lodBounds[ndx] >= q)
			{
				levelBounds[ndx] = deRoundFloatToInt32(q);
			}
			else
			{
				levelBounds[ndx] = lodBounds[ndx] < 0.0f ? 0 : deFloorFloatToInt32(lodBounds[ndx]);
			}
		}
	}

	return levelBounds;
}